

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

Abc_Cex_t * Gla_ManDeriveCex(Gla_Man_t *p,Vec_Int_t *vPis)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Cex_t *pAVar4;
  bool bVar5;
  int local_30;
  int local_2c;
  int f;
  int i;
  Gia_Obj_t *pObj;
  Abc_Cex_t *pCex;
  Vec_Int_t *vPis_local;
  Gla_Man_t *p_local;
  
  iVar1 = Gia_ManRegNum(p->pGia);
  iVar2 = Gia_ManPiNum(p->pGia);
  pAVar4 = Abc_CexAlloc(iVar1,iVar2,p->pPars->iFrame + 1);
  pAVar4->iPo = 0;
  pAVar4->iFrame = p->pPars->iFrame;
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vPis);
    bVar5 = false;
    if (local_2c < iVar1) {
      p_00 = p->pGia;
      iVar1 = Vec_IntEntry(vPis,local_2c);
      _f = Gia_ManObj(p_00,iVar1);
      bVar5 = _f != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsPi(p->pGia,_f);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjIsPi(p->pGia,_f);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsPi(p->pGia, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,200,"Abc_Cex_t *Gla_ManDeriveCex(Gla_Man_t *, Vec_Int_t *)");
      }
      for (local_30 = 0; local_30 <= pAVar4->iFrame; local_30 = local_30 + 1) {
        iVar1 = Gia_ObjId(p->pGia,_f);
        iVar1 = Gla_ObjSatValue(p,iVar1,local_30);
        if (iVar1 != 0) {
          iVar1 = pAVar4->nRegs;
          iVar2 = pAVar4->nPis;
          iVar3 = Gia_ObjCioId(_f);
          Abc_InfoSetBit((uint *)(pAVar4 + 1),iVar1 + local_30 * iVar2 + iVar3);
        }
      }
    }
    local_2c = local_2c + 1;
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Gla_ManDeriveCex( Gla_Man_t * p, Vec_Int_t * vPis )
{
    Abc_Cex_t * pCex;
    Gia_Obj_t * pObj;
    int i, f;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Gia_ManForEachObjVec( vPis, p->pGia, pObj, i )
    {
        if ( !Gia_ObjIsPi(p->pGia, pObj) )
            continue;
        assert( Gia_ObjIsPi(p->pGia, pObj) );
        for ( f = 0; f <= pCex->iFrame; f++ )
            if ( Gla_ObjSatValue( p, Gia_ObjId(p->pGia, pObj), f ) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Gia_ObjCioId(pObj) );
    }
    return pCex;
}